

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_20.cpp
# Opt level: O1

void __thiscall GLFlat::DrawLightsCompat(GLFlat *this,int pass)

{
  uint uVar1;
  sector_t *psVar2;
  long lVar3;
  undefined8 *puVar4;
  
  FRenderState::Apply(&gl_RenderState);
  psVar2 = this->sector;
  if (0 < psVar2->subsectorcount) {
    lVar3 = 0;
    do {
      if (((gl_drawinfo->ss_renderflags).Array
           [((long)psVar2->subsectors[lVar3] - (long)subsectors >> 5) * -0x5555555555555555] &
          this->renderflags) != 0) {
        DrawSubsectorLights(this,psVar2->subsectors[lVar3],pass);
      }
      lVar3 = lVar3 + 1;
      psVar2 = this->sector;
    } while (lVar3 < psVar2->subsectorcount);
  }
  if ((this->renderflags & 4) == 0) {
    if ((this->renderflags & 1) == 0) {
      lVar3 = 0x98;
      uVar1 = (gl_drawinfo->otherceilingplanes).Count;
    }
    else {
      lVar3 = 0x88;
      uVar1 = (gl_drawinfo->otherfloorplanes).Count;
    }
    if ((uint)psVar2->sectornum < uVar1) {
      puVar4 = *(undefined8 **)
                (*(long *)(&gl_drawinfo->temporary + lVar3) + (ulong)(uint)psVar2->sectornum * 8);
    }
    else {
      puVar4 = (undefined8 *)0x0;
    }
    for (; puVar4 != (undefined8 *)0x0; puVar4 = (undefined8 *)*puVar4) {
      DrawSubsectorLights(this,(subsector_t *)puVar4[1],pass);
    }
    return;
  }
  return;
}

Assistant:

void GLFlat::DrawLightsCompat(int pass)
{
	gl_RenderState.Apply();
	// Draw the subsectors belonging to this sector
	for (int i = 0; i<sector->subsectorcount; i++)
	{
		subsector_t * sub = sector->subsectors[i];
		if (gl_drawinfo->ss_renderflags[sub - subsectors] & renderflags)
		{
			DrawSubsectorLights(sub, pass);
		}
	}

	// Draw the subsectors assigned to it due to missing textures
	if (!(renderflags&SSRF_RENDER3DPLANES))
	{
		gl_subsectorrendernode * node = (renderflags&SSRF_RENDERFLOOR) ?
			gl_drawinfo->GetOtherFloorPlanes(sector->sectornum) :
			gl_drawinfo->GetOtherCeilingPlanes(sector->sectornum);

		while (node)
		{
			DrawSubsectorLights(node->sub, pass);
			node = node->next;
		}
	}
}